

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O1

cbtPersistentManifold * __thiscall
cbtCollisionDispatcher::getNewManifold
          (cbtCollisionDispatcher *this,cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  cbtPersistentManifold **ptr;
  undefined1 auVar4 [16];
  cbtScalar *pcVar5;
  cbtPersistentManifold *pcVar6;
  long lVar7;
  cbtPersistentManifold **ppcVar8;
  long lVar9;
  int iVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  float local_38;
  float local_34;
  
  if ((this->m_dispatcherFlags & 2) == 0) {
    pcVar5 = &gContactBreakingThreshold;
  }
  else {
    cVar11 = gContactBreakingThreshold;
    (*body0->m_collisionShape->_vptr_cbtCollisionShape[5])();
    cVar12 = gContactBreakingThreshold;
    local_34 = cVar11;
    (*body1->m_collisionShape->_vptr_cbtCollisionShape[5])();
    local_38 = cVar12;
    pcVar5 = &local_38;
    if (cVar11 < cVar12) {
      pcVar5 = &local_34;
    }
  }
  cVar11 = *pcVar5;
  auVar4 = vminss_avx(ZEXT416((uint)body0->m_contactProcessingThreshold),
                      ZEXT416((uint)body1->m_contactProcessingThreshold));
  pcVar6 = (cbtPersistentManifold *)
           cbtPoolAllocator::allocate(this->m_persistentManifoldPoolAllocator,0x3b0);
  if (pcVar6 == (cbtPersistentManifold *)0x0) {
    if ((this->m_dispatcherFlags & 4) != 0) {
      return (cbtPersistentManifold *)0x0;
    }
    pcVar6 = (cbtPersistentManifold *)cbtAlignedAllocInternal(0x3b0,0x10);
  }
  (pcVar6->super_cbtTypedObject).m_objectType = 0x401;
  lVar7 = 0x98;
  do {
    puVar1 = (undefined8 *)((long)pcVar6 + lVar7 + -0x90);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)pcVar6 + lVar7 + -0x80) = 0;
    puVar1 = (undefined8 *)((long)pcVar6->m_pointCache[0].reactions_cache + lVar7 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1 = (undefined8 *)((long)pcVar6->m_pointCache[0].reactions_cache + lVar7 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    lVar7 = lVar7 + 0xe0;
  } while (lVar7 != 0x418);
  pcVar6->m_body0 = body0;
  pcVar6->m_body1 = body1;
  pcVar6->m_cachedPoints = 0;
  pcVar6->m_contactBreakingThreshold = cVar11;
  pcVar6->m_contactProcessingThreshold = auVar4._0_4_;
  pcVar6->m_companionIdA = 0;
  pcVar6->m_companionIdB = 0;
  pcVar6->m_index1a = 0;
  iVar2 = (this->m_manifoldsPtr).m_size;
  pcVar6->m_index1a = iVar2;
  iVar3 = (this->m_manifoldsPtr).m_capacity;
  if (iVar2 == iVar3) {
    iVar10 = 1;
    if (iVar2 != 0) {
      iVar10 = iVar2 * 2;
    }
    if (iVar3 < iVar10) {
      if (iVar10 == 0) {
        ppcVar8 = (cbtPersistentManifold **)0x0;
      }
      else {
        ppcVar8 = (cbtPersistentManifold **)cbtAlignedAllocInternal((long)iVar10 << 3,0x10);
      }
      lVar7 = (long)(this->m_manifoldsPtr).m_size;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          ppcVar8[lVar9] = (this->m_manifoldsPtr).m_data[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      ptr = (this->m_manifoldsPtr).m_data;
      if (ptr != (cbtPersistentManifold **)0x0) {
        if ((this->m_manifoldsPtr).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_manifoldsPtr).m_data = (cbtPersistentManifold **)0x0;
      }
      (this->m_manifoldsPtr).m_ownsMemory = true;
      (this->m_manifoldsPtr).m_data = ppcVar8;
      (this->m_manifoldsPtr).m_capacity = iVar10;
    }
  }
  iVar2 = (this->m_manifoldsPtr).m_size;
  (this->m_manifoldsPtr).m_data[iVar2] = pcVar6;
  (this->m_manifoldsPtr).m_size = iVar2 + 1;
  return pcVar6;
}

Assistant:

cbtPersistentManifold* cbtCollisionDispatcher::getNewManifold(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	//cbtAssert(gNumManifold < 65535);

	//optional relative contact breaking threshold, turned on by default (use setDispatcherFlags to switch off feature for improved performance)

	cbtScalar contactBreakingThreshold = (m_dispatcherFlags & cbtCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD) ? cbtMin(body0->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold), body1->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold))
																																: gContactBreakingThreshold;

	cbtScalar contactProcessingThreshold = cbtMin(body0->getContactProcessingThreshold(), body1->getContactProcessingThreshold());

	void* mem = m_persistentManifoldPoolAllocator->allocate(sizeof(cbtPersistentManifold));
	if (NULL == mem)
	{
		//we got a pool memory overflow, by default we fallback to dynamically allocate memory. If we require a contiguous contact pool then assert.
		if ((m_dispatcherFlags & CD_DISABLE_CONTACTPOOL_DYNAMIC_ALLOCATION) == 0)
		{
			mem = cbtAlignedAlloc(sizeof(cbtPersistentManifold), 16);
		}
		else
		{
			cbtAssert(0);
			//make sure to increase the m_defaultMaxPersistentManifoldPoolSize in the cbtDefaultCollisionConstructionInfo/cbtDefaultCollisionConfiguration
			return 0;
		}
	}
	cbtPersistentManifold* manifold = new (mem) cbtPersistentManifold(body0, body1, 0, contactBreakingThreshold, contactProcessingThreshold);
	manifold->m_index1a = m_manifoldsPtr.size();
	m_manifoldsPtr.push_back(manifold);

	return manifold;
}